

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void outputVector<double>
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *vector,string *filename)

{
  long lVar1;
  pointer pvVar2;
  int j;
  ulong uVar3;
  int i;
  ulong uVar4;
  ofstream stream;
  
  std::ofstream::ofstream((string *)&stream);
  std::ofstream::open((string *)&stream,(_Ios_Openmode)filename);
  uVar4 = 0;
  while( true ) {
    pvVar2 = (vector->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(vector->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) <= uVar4)
    break;
    for (uVar3 = 0;
        lVar1 = *(long *)&pvVar2[uVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data,
        uVar3 < (ulong)((long)*(pointer *)
                               ((long)&pvVar2[uVar4].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + 8) - lVar1 >> 3); uVar3 = uVar3 + 1
        ) {
      std::ostream::_M_insert<double>(*(double *)(lVar1 + uVar3 * 8));
      pvVar2 = (vector->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (uVar3 != ((long)*(pointer *)
                           ((long)&pvVar2[uVar4].super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data + 8) -
                    *(long *)&pvVar2[uVar4].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data >> 3) - 1U) {
        std::operator<<((ostream *)&stream,',');
        pvVar2 = (vector->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&stream);
    uVar4 = uVar4 + 1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&stream);
  return;
}

Assistant:

void outputVector(const std::vector<std::vector<T> > &vector, std::string filename){
    std::ofstream stream;
    stream.open(filename, std::ios::out);

    for(int i=0;i<vector.size();i++){
        for(int j=0;j<vector[i].size();j++){
            stream<<vector[i][j];
            if(j!=(vector[i].size()-1)){
                stream<<',';
            }
        }
        stream<<std::endl;
    }
    stream.close();
}